

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

int accept_pathname(char *pathname)

{
  int iVar1;
  pattern_list *ppVar2;
  
  if (include.stqh_first != (pattern *)0x0) {
    ppVar2 = &include;
    do {
      ppVar2 = (pattern_list *)ppVar2->stqh_first;
      if (ppVar2 == (pattern_list *)0x0) {
        return 0;
      }
      iVar1 = fnmatch((char *)&ppVar2->stqh_last,pathname,(uint)C_opt << 4);
    } while (iVar1 != 0);
    if (ppVar2 == (pattern_list *)0x0) {
      return 0;
    }
  }
  if (exclude.stqh_first != (pattern *)0x0) {
    ppVar2 = &exclude;
    do {
      ppVar2 = (pattern_list *)ppVar2->stqh_first;
      if (ppVar2 == (pattern_list *)0x0) {
        return 1;
      }
      iVar1 = fnmatch((char *)&ppVar2->stqh_last,pathname,(uint)C_opt << 4);
    } while (iVar1 != 0);
    if (ppVar2 != (pattern_list *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int
accept_pathname(const char *pathname)
{

	if (!STAILQ_EMPTY(&include) && !match_pattern(&include, pathname))
		return (0);
	if (!STAILQ_EMPTY(&exclude) && match_pattern(&exclude, pathname))
		return (0);
	return (1);
}